

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_pool.hpp
# Opt level: O0

void __thiscall
coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>::client_pool
          (void *param_1,size_t param_2,undefined8 param_3,undefined8 param_4,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param_5,
          basic_string_view<char,_std::char_traits<char>_> *param_6)

{
  pool_config *ppVar1;
  pool_config *this;
  allocator<char> *in_stack_ffffffffffffffc0;
  client_queue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>_>
  *this_00;
  
  this_00 = (client_queue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>_>
             *)param_1;
  std::
  enable_shared_from_this<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
  ::enable_shared_from_this
            ((enable_shared_from_this<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
              *)0x3493c1);
  detail::
  client_queue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>_>
  ::client_queue(this_00,param_2);
  detail::
  client_queue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>_>
  ::client_queue(this_00,param_2);
  *(size_t *)((long)param_1 + 0x9f0) = param_2;
  async_simple::Promise<async_simple::Unit>::Promise((Promise<async_simple::Unit> *)param_5);
  ppVar1 = (pool_config *)((long)param_1 + 0xa08);
  this = (pool_config *)&stack0xffffffffffffffbb;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (param_5,param_6,in_stack_ffffffffffffffc0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffbb);
  pool_config::pool_config(this,ppVar1);
  *(basic_string_view<char,_std::char_traits<char>_> **)((long)param_1 + 0xb48) = param_6;
  std::atomic<bool>::atomic((atomic<bool> *)this,SUB81((ulong)ppVar1 >> 0x38,0));
  return;
}

Assistant:

client_pool(private_construct_token t, client_pools_t* pools_manager_,
              std::string_view host_name, const pool_config& pool_config,
              io_context_pool_t& io_context_pool)
      : pools_manager_(pools_manager_),
        host_name_(host_name),
        pool_config_(pool_config),
        io_context_pool_(io_context_pool),
        free_clients_(pool_config.max_connection){}